

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

QTreeWidgetItem * __thiscall QTreeWidgetItem::takeChild(QTreeWidgetItem *this,int index)

{
  bool bVar1;
  QTreeModel *pQVar2;
  QTreeWidgetItem *parent;
  qsizetype qVar3;
  QTreeWidgetItem *pQVar4;
  long lVar5;
  int in_ESI;
  QTreeModel *in_RDI;
  long in_FS_OFFSET;
  int c;
  QTreeWidgetItem *i;
  QTreeModel *model;
  QStack<QTreeWidgetItem_*> stack;
  QTreeWidgetItem *item;
  QTreeWidgetItem **in_stack_ffffffffffffff78;
  QList<QTreeWidgetItem_*> *in_stack_ffffffffffffff80;
  QTreeModel *in_stack_ffffffffffffff88;
  QTreeWidgetItem *in_stack_ffffffffffffff90;
  QList<QTreeWidgetItem_*> *this_00;
  int local_54;
  QTreeWidgetItem *local_30;
  QTreeWidgetItem *item_00;
  QTreeWidgetItem *item_01;
  
  item_01 = *(QTreeWidgetItem **)(in_FS_OFFSET + 0x28);
  pQVar2 = treeModel(in_stack_ffffffffffffff90,(QTreeWidget *)in_stack_ffffffffffffff88);
  if (pQVar2 != (QTreeModel *)0x0) {
    pQVar2->skipPendingSort = false;
    QTreeModel::executePendingSort(in_stack_ffffffffffffff88);
  }
  if (-1 < in_ESI) {
    parent = (QTreeWidgetItem *)(long)in_ESI;
    qVar3 = QList<QTreeWidgetItem_*>::size((QList<QTreeWidgetItem_*> *)&(in_RDI->iterators).d.ptr);
    if ((long)parent < qVar3) {
      if (pQVar2 != (QTreeModel *)0x0) {
        QTreeModel::beginRemoveItems
                  (in_RDI,parent,(int)((ulong)in_stack_ffffffffffffff90 >> 0x20),
                   (int)in_stack_ffffffffffffff90);
      }
      this_00 = (QList<QTreeWidgetItem_*> *)(in_RDI->cachedIndexes).d.size;
      QList<QTreeWidgetItem_*>::at(in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
      QTreeWidgetItemPrivate::updateHiddenStatus
                ((QTreeWidgetItemPrivate *)in_RDI,item_01,SUB81((ulong)parent >> 0x38,0));
      local_30 = QList<QTreeWidgetItem_*>::takeAt(this_00,(qsizetype)in_stack_ffffffffffffff88);
      local_30->par = (QTreeWidgetItem *)0x0;
      item_00 = (QTreeWidgetItem *)&DAT_aaaaaaaaaaaaaaaa;
      QStack<QTreeWidgetItem_*>::QStack((QStack<QTreeWidgetItem_*> *)0x90ff7a);
      QStack<QTreeWidgetItem_*>::push
                ((QStack<QTreeWidgetItem_*> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      while (bVar1 = QList<QTreeWidgetItem_*>::isEmpty((QList<QTreeWidgetItem_*> *)0x90ff93),
            ((bVar1 ^ 0xffU) & 1) != 0) {
        pQVar4 = QStack<QTreeWidgetItem_*>::pop((QStack<QTreeWidgetItem_*> *)0x90ffa5);
        pQVar4->view = (QTreeWidget *)0x0;
        local_54 = 0;
        while( true ) {
          lVar5 = (long)local_54;
          qVar3 = QList<QTreeWidgetItem_*>::size(&pQVar4->children);
          if (qVar3 <= lVar5) break;
          QList<QTreeWidgetItem_*>::at
                    (in_stack_ffffffffffffff80,(qsizetype)in_stack_ffffffffffffff78);
          QStack<QTreeWidgetItem_*>::push
                    ((QStack<QTreeWidgetItem_*> *)in_stack_ffffffffffffff80,
                     in_stack_ffffffffffffff78);
          local_54 = local_54 + 1;
        }
      }
      QTreeWidgetItemPrivate::propagateDisabled((QTreeWidgetItemPrivate *)parent,item_00);
      if (pQVar2 != (QTreeModel *)0x0) {
        QAbstractItemModel::endRemoveRows();
      }
      QStack<QTreeWidgetItem_*>::~QStack((QStack<QTreeWidgetItem_*> *)0x91004f);
      goto LAB_0091005a;
    }
  }
  local_30 = (QTreeWidgetItem *)0x0;
LAB_0091005a:
  if (*(QTreeWidgetItem **)(in_FS_OFFSET + 0x28) != item_01) {
    __stack_chk_fail();
  }
  return local_30;
}

Assistant:

QTreeWidgetItem *QTreeWidgetItem::takeChild(int index)
{
    // we move this outside the check of the index to allow executing
    // pending sorts from inline functions, using this function (hack)
    QTreeModel *model = treeModel();
    if (model) {
        // This will trigger a layoutChanged signal, thus we might want to optimize
        // this function by not emitting the rowsRemoved signal etc to the view.
        // On the other hand we also need to make sure that the selectionmodel
        // is updated in case we take an item that is selected.
        model->skipPendingSort = false;
        model->executePendingSort();
    }
    if (index >= 0 && index < children.size()) {
        if (model) model->beginRemoveItems(this, index, 1);
        d->updateHiddenStatus(children.at(index), false);
        QTreeWidgetItem *item = children.takeAt(index);
        item->par = nullptr;
        QStack<QTreeWidgetItem*> stack;
        stack.push(item);
        while (!stack.isEmpty()) {
            QTreeWidgetItem *i = stack.pop();
            i->view = nullptr;
            for (int c = 0; c < i->children.size(); ++c)
                stack.push(i->children.at(c));
        }
        d->propagateDisabled(item);
        if (model) model->endRemoveRows();
        return item;
    }
    return nullptr;
}